

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::WindowDataParameter::SharedCtor(WindowDataParameter *this)

{
  this->_cached_size_ = 0;
  (this->source_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->mean_file_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->crop_mode_).ptr_ = (string *)&_default_crop_mode__abi_cxx11_;
  (this->root_folder_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->batch_size_ = 0;
  this->crop_size_ = 0;
  this->mirror_ = false;
  this->cache_images_ = false;
  *(undefined2 *)&this->field_0x42 = 0;
  this->context_pad_ = 0;
  this->scale_ = 1.0;
  this->fg_threshold_ = 0.5;
  this->bg_threshold_ = 0.5;
  this->fg_fraction_ = 0.25;
  return;
}

Assistant:

void WindowDataParameter::SharedCtor() {
  _cached_size_ = 0;
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  mean_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  crop_mode_.UnsafeSetDefault(&WindowDataParameter::_default_crop_mode_.get());
  root_folder_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&batch_size_, 0, reinterpret_cast<char*>(&context_pad_) -
    reinterpret_cast<char*>(&batch_size_) + sizeof(context_pad_));
  scale_ = 1;
  fg_threshold_ = 0.5f;
  bg_threshold_ = 0.5f;
  fg_fraction_ = 0.25f;
}